

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int refs_from_header(refs_t *r,cram_fd *fd,SAM_hdr *h)

{
  cram_file_def *pcVar1;
  void *pvVar2;
  char *pcVar3;
  int local_48;
  khint_t local_44;
  int n;
  khint_t k;
  SAM_hdr_tag *tag;
  SAM_hdr_type *ty;
  int j;
  int i;
  SAM_hdr *h_local;
  cram_fd *fd_local;
  refs_t *r_local;
  
  if ((h == (SAM_hdr *)0x0) || (h->nref == 0)) {
    r_local._4_4_ = 0;
  }
  else {
    _j = h;
    h_local = (SAM_hdr *)fd;
    fd_local = (cram_fd *)r;
    pcVar1 = (cram_file_def *)realloc(r->ref_id,(long)(r->nref + h->nref) << 3);
    fd_local->file_def = pcVar1;
    if (pcVar1 == (cram_file_def *)0x0) {
      r_local._4_4_ = -1;
    }
    else {
      ty._4_4_ = 0;
      ty._0_4_ = *(int *)&fd_local->header;
      for (; ty._4_4_ < _j->nref; ty._4_4_ = ty._4_4_ + 1) {
        local_44 = kh_get_refs(*(kh_refs_t **)&fd_local->mode,_j->ref[ty._4_4_].name);
        if (local_44 == **(khint_t **)&fd_local->mode) {
          pvVar2 = calloc(1,0x38);
          *(void **)(fd_local->file_def->magic + (long)(int)ty * 8) = pvVar2;
          if (pvVar2 == (void *)0x0) {
            return -1;
          }
          if (_j->ref[(int)ty].name == (char *)0x0) {
            return -1;
          }
          pcVar3 = string_dup((string_alloc_t *)fd_local->fp,_j->ref[ty._4_4_].name);
          **(undefined8 **)(fd_local->file_def->magic + (long)(int)ty * 8) = pcVar3;
          *(undefined8 *)(*(long *)(fd_local->file_def->magic + (long)(int)ty * 8) + 0x10) = 0;
          tag = (SAM_hdr_tag *)sam_hdr_find(_j,"SQ","SN",_j->ref[ty._4_4_].name);
          if (((SAM_hdr_type *)tag != (SAM_hdr_type *)0x0) &&
             (_n = sam_hdr_find_key(_j,(SAM_hdr_type *)tag,"M5",(SAM_hdr_tag **)0x0),
             _n != (SAM_hdr_tag *)0x0)) {
            pcVar3 = string_dup((string_alloc_t *)fd_local->fp,_n->str + 3);
            *(char **)(*(long *)(fd_local->file_def->magic + (long)(int)ty * 8) + 8) = pcVar3;
          }
          local_44 = kh_put_refs(*(kh_refs_t **)&fd_local->mode,
                                 (kh_cstr_t)
                                 **(undefined8 **)(fd_local->file_def->magic + (long)(int)ty * 8),
                                 &local_48);
          if (local_48 < 1) {
            return -1;
          }
          *(undefined8 *)(*(long *)(*(long *)&fd_local->mode + 0x20) + (ulong)local_44 * 8) =
               *(undefined8 *)(fd_local->file_def->magic + (long)(int)ty * 8);
          ty._0_4_ = (int)ty + 1;
        }
      }
      *(int *)&fd_local->header = (int)ty;
      r_local._4_4_ = 0;
    }
  }
  return r_local._4_4_;
}

Assistant:

static int refs_from_header(refs_t *r, cram_fd *fd, SAM_hdr *h) {
    int i, j;

    if (!h || h->nref == 0)
	return 0;

    //fprintf(stderr, "refs_from_header for %p mode %c\n", fd, fd->mode);

    /* Existing refs are fine, as long as they're compatible with the hdr. */
    if (!(r->ref_id = realloc(r->ref_id, (r->nref + h->nref) * sizeof(*r->ref_id))))
	return -1;

    /* Copy info from h->ref[i] over to r */
    for (i = 0, j = r->nref; i < h->nref; i++) {
	SAM_hdr_type *ty;
	SAM_hdr_tag *tag;
	khint_t k;
	int n;

	k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta))
	    // Ref already known about
	    continue;

	if (!(r->ref_id[j] = calloc(1, sizeof(ref_entry))))
	    return -1;

	if (!h->ref[j].name)
	    return -1;

	r->ref_id[j]->name = string_dup(r->pool, h->ref[i].name);
	r->ref_id[j]->length = 0; // marker for not yet loaded

	/* Initialise likely filename if known */
	if ((ty = sam_hdr_find(h, "SQ", "SN", h->ref[i].name))) {
	    if ((tag = sam_hdr_find_key(h, ty, "M5", NULL))) {
		r->ref_id[j]->fn = string_dup(r->pool, tag->str+3);
		//fprintf(stderr, "Tagging @SQ %s / %s\n", r->ref_id[h]->name, r->ref_id[h]->fn);
	    }
	}

	k = kh_put(refs, r->h_meta, r->ref_id[j]->name, &n);
	if (n <= 0) // already exists or error
	    return -1;
	kh_val(r->h_meta, k) = r->ref_id[j];

	j++;
    }
    r->nref = j;

    return 0;
}